

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O3

int __thiscall cmCPackRPMGenerator::PackageComponents(cmCPackRPMGenerator *this,bool ignoreGroup)

{
  _Rb_tree_header *p_Var1;
  cmCPackLog *pcVar2;
  long *plVar3;
  uint uVar4;
  char *pcVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  size_t sVar8;
  uint uVar9;
  string initialTopLevel;
  ostringstream cmCPackLog_msg;
  long *local_2b0 [2];
  long local_2a0 [2];
  _Rb_tree_node_base *local_290;
  long *local_288;
  long local_280;
  long local_278 [2];
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->super_cmCPackGenerator).packageFileNames,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
  std::__cxx11::string::string((string *)&local_288,pcVar5,(allocator *)local_2b0);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (ignoreGroup) {
    p_Var6 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
    uVar9 = 1;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,local_288,local_280 + (long)local_288);
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        uVar4 = PackageOnePack(this,&local_248,&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        uVar9 = uVar9 & uVar4;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
  }
  else {
    p_Var6 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    local_290 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    uVar9 = 1;
    if (p_Var6 != local_290) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Packaging component group: ",0x1b);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        plVar3 = local_2b0[0];
        sVar8 = strlen((char *)local_2b0[0]);
        cmCPackLog::Log(pcVar2,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                        ,0x73,(char *)plVar3,sVar8);
        if (local_2b0[0] != local_2a0) {
          operator_delete(local_2b0[0],local_2a0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_288,local_280 + (long)local_288);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        uVar4 = PackageOnePack(this,&local_208,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        uVar9 = uVar9 & uVar4;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != local_290);
    }
    p_Var6 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    local_290 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    if (p_Var6 != local_290) {
      do {
        if (*(long *)(p_Var6 + 4) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Component <",0xb)
          ;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"> does not belong to any group, package it separately.",0x36);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar3 = local_2b0[0];
          sVar8 = strlen((char *)local_2b0[0]);
          cmCPackLog::Log(pcVar2,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0x82,(char *)plVar3,sVar8);
          if (local_2b0[0] != local_2a0) {
            operator_delete(local_2b0[0],local_2a0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,local_288,local_280 + (long)local_288);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,*(long *)(p_Var6 + 1),
                     (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
          uVar4 = PackageOnePack(this,&local_1e8,&local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          uVar9 = uVar4 & uVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != local_290);
    }
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  return uVar9;
}

Assistant:

int cmCPackRPMGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup)
    {
    std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
    for (compGIt=this->ComponentGroups.begin();
        compGIt!=this->ComponentGroups.end(); ++compGIt)
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Packaging component group: "
          << compGIt->first
          << std::endl);
      retval &= PackageOnePack(initialTopLevel,compGIt->first);
      }
    // Handle Orphan components (components not belonging to any groups)
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt=this->Components.begin();
        compIt!=this->Components.end(); ++compIt )
      {
      // Does the component belong to a group?
      if (compIt->second.Group==NULL)
        {
        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
            "Component <"
            << compIt->second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        retval &= PackageOnePack(initialTopLevel,compIt->first);
        }
      }
    }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else
    {
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt=this->Components.begin();
         compIt!=this->Components.end(); ++compIt )
      {
      retval &= PackageOnePack(initialTopLevel,compIt->first);
      }
    }
  return retval;
}